

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Circle.cc
# Opt level: O0

void anon_unknown.dwarf_cdd::updateVisualization(RVOSimulator *simulator)

{
  size_t sVar1;
  ostream *poVar2;
  Vector2 *pVVar3;
  RVOSimulator *in_RDI;
  float fVar4;
  size_t i;
  ulong local_10;
  
  fVar4 = RVO::RVOSimulator::getGlobalTime(in_RDI);
  std::ostream::operator<<((ostream *)&std::cout,fVar4);
  local_10 = 0;
  while( true ) {
    sVar1 = RVO::RVOSimulator::getNumAgents((RVOSimulator *)0x1026bc);
    if (sVar1 <= local_10) break;
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    pVVar3 = (Vector2 *)RVO::RVOSimulator::getAgentPosition((ulong)in_RDI);
    RVO::operator<<(poVar2,pVVar3);
    local_10 = local_10 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void updateVisualization(RVO::RVOSimulator *simulator) {
  /* Output the current global time. */
  std::cout << simulator->getGlobalTime();

  /* Output the current position of all the agents. */
  for (std::size_t i = 0U; i < simulator->getNumAgents(); ++i) {
    std::cout << " " << simulator->getAgentPosition(i);
  }

  std::cout << std::endl;
}